

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grapheme.cpp
# Opt level: O1

void __thiscall unicpp::grapheme::grapheme(grapheme *this,u32string *codepoints)

{
  pointer pcVar1;
  utf8proc_bool uVar2;
  uint in_EAX;
  runtime_error *this_00;
  size_t i;
  ulong uVar3;
  utf8proc_int32_t state;
  undefined8 uStack_28;
  
  (this->m_codepoints)._M_dataplus._M_p = (pointer)&(this->m_codepoints).field_2;
  pcVar1 = (codepoints->_M_dataplus)._M_p;
  uStack_28._0_4_ = in_EAX;
  std::__cxx11::u32string::_M_construct<char32_t*>
            ((u32string *)this,pcVar1,pcVar1 + codepoints->_M_string_length);
  uStack_28 = (ulong)(uint)uStack_28;
  uVar3 = 0;
  do {
    if ((this->m_codepoints)._M_string_length - 1 <= uVar3) {
      return;
    }
    pcVar1 = (this->m_codepoints)._M_dataplus._M_p;
    uVar2 = utf8proc_grapheme_break_stateful
                      (pcVar1[uVar3],pcVar1[uVar3 + 1],(utf8proc_int32_t *)((long)&uStack_28 + 4));
    uVar3 = uVar3 + 1;
  } while (!uVar2);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Found an grapheme break in a grapheme!");
  *(undefined ***)this_00 = &PTR__runtime_error_001bc908;
  __cxa_throw(this_00,&invalid_grapheme_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

grapheme::grapheme(const std::u32string & codepoints) :
    m_codepoints(codepoints)
{
    //Check if it's a single grapheme
    utf8proc_int32_t state = 0;
    for(std::size_t i = 0; i < m_codepoints.size() - 1; ++i)
    {
        if(utf8proc_grapheme_break_stateful(m_codepoints[i], m_codepoints[i + 1], &state))
            throw invalid_grapheme_exception("Found an grapheme break in a grapheme!");
    }
}